

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
libtorrent::lsplit_path
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,libtorrent *this,string_view p)

{
  size_type __n;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view p_local;
  
  p_local._M_str = (char *)p._M_len;
  if (this == (libtorrent *)0x0) {
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (char *)0x0;
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char *)0x0;
  }
  else {
    p_local._M_len = (size_t)this;
    if (*p_local._M_str == '/') {
      p_local._M_str = p_local._M_str + 1;
      p_local._M_len = (size_t)(this + -1);
    }
    __n = ::std::basic_string_view<char,_std::char_traits<char>_>::find(&p_local,'/',0);
    if (__n == 0xffffffffffffffff) {
      (__return_storage_ptr__->second)._M_len = 0;
      (__return_storage_ptr__->second)._M_str = (char *)0x0;
      (__return_storage_ptr__->first)._M_len = p_local._M_len;
      (__return_storage_ptr__->first)._M_str = p_local._M_str;
    }
    else {
      bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr(&p_local,0,__n);
      bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&p_local,__n + 1,0xffffffffffffffff);
      __return_storage_ptr__->first = bVar1;
      __return_storage_ptr__->second = bVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, string_view> lsplit_path(string_view p)
	{
		if (p.empty()) return {{}, {}};
		// for absolute paths, skip the initial "/"
		if (p.front() == TORRENT_SEPARATOR_CHAR) p.remove_prefix(1);
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
		else if (p.front() == '/') p.remove_prefix(1);
#endif
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
		auto const sep = p.find_first_of("/\\");
#else
		auto const sep = p.find_first_of(TORRENT_SEPARATOR_CHAR);
#endif
		if (sep == string_view::npos) return {p, {}};
		return { p.substr(0, sep), p.substr(sep + 1) };
	}